

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disjoint_sets.cpp
# Opt level: O0

void __thiscall
geometrycentral::MarkedDisjointSets::merge(MarkedDisjointSets *this,size_t x,size_t y)

{
  value_type vVar1;
  bool bVar2;
  reference pvVar3;
  size_type in_RDI;
  bool local_81;
  size_t in_stack_ffffffffffffff88;
  size_type sVar4;
  MarkedDisjointSets *in_stack_ffffffffffffff90;
  vector<bool,_std::allocator<bool>_> *this_00;
  reference local_58;
  reference local_48;
  reference local_38;
  reference local_28;
  size_type local_18;
  size_type local_10;
  
  local_10 = find(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  local_18 = find(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x20),
                      local_10);
  this_00 = (vector<bool,_std::allocator<bool>_> *)*pvVar3;
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x20),
                      local_18);
  if ((vector<bool,_std::allocator<bool>_> *)*pvVar3 < this_00) {
    sVar4 = local_10;
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 8),
                        local_18);
    *pvVar3 = sVar4;
  }
  else {
    sVar4 = local_18;
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 8),
                        local_10);
    *pvVar3 = sVar4;
  }
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x20),
                      local_10);
  vVar1 = *pvVar3;
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x20),
                      local_18);
  if (vVar1 == *pvVar3) {
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x20),
                        local_18);
    *pvVar3 = *pvVar3 + 1;
  }
  local_28 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,in_RDI);
  bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_28);
  local_81 = true;
  if (!bVar2) {
    local_38 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,in_RDI);
    local_81 = std::_Bit_reference::operator_cast_to_bool(&local_38);
  }
  if (local_81 != false) {
    local_48 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,in_RDI);
    std::_Bit_reference::operator=(&local_48,true);
    local_58 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,in_RDI);
    std::_Bit_reference::operator=(&local_58,true);
  }
  return;
}

Assistant:

void MarkedDisjointSets::merge(size_t x, size_t y) {
  x = find(x);
  y = find(y);

  // Smaller tree becomes a subtree of the larger tree
  if (rank[x] > rank[y])
    parent[y] = x;
  else
    parent[x] = y;

  if (rank[x] == rank[y]) rank[y]++;

  // If either was marked, both are marked
  if (marked[x] || marked[y]) {
    marked[x] = true;
    marked[y] = true;
  }
}